

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_unsigned_long>
google::protobuf::internal::VarintParseSlow64(char *p,uint32_t res32)

{
  int local_54;
  void *local_50;
  char *local_48;
  ulong local_40;
  uint64_t byte;
  ulong uStack_30;
  uint32_t i;
  uint64_t res;
  char *pcStack_20;
  uint32_t res32_local;
  char *p_local;
  
  uStack_30 = (ulong)res32;
  byte._4_4_ = 1;
  while( true ) {
    res._4_4_ = res32;
    pcStack_20 = p;
    if (9 < byte._4_4_) {
      local_50 = (void *)0x0;
      local_54 = 0;
      std::pair<const_char_*,_unsigned_long>::pair<std::nullptr_t,_int,_true>
                ((pair<const_char_*,_unsigned_long> *)&p_local,&local_50,&local_54);
      return _p_local;
    }
    local_40 = (ulong)(byte)p[byte._4_4_];
    uStack_30 = (local_40 - 1 << ((char)byte._4_4_ * '\a' & 0x3fU)) + uStack_30;
    if (local_40 < 0x80) break;
    byte._4_4_ = byte._4_4_ + 1;
  }
  local_48 = p + (ulong)byte._4_4_ + 1;
  std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long_&,_true>
            ((pair<const_char_*,_unsigned_long> *)&p_local,&local_48,&stack0xffffffffffffffd0);
  return _p_local;
}

Assistant:

std::pair<const char*, uint64_t> VarintParseSlow64(const char* p,
                                                   uint32_t res32) {
  uint64_t res = res32;
  for (std::uint32_t i = 1; i < 10; i++) {
    uint64_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}